

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O3

size_t bpkiPrivkeyDec(octet *privkey,size_t *privkey_len,octet *pki,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  octet *poVar4;
  octet *poVar5;
  size_t sVar6;
  der_anchor_t BignAlgId [1];
  der_anchor_t PKI [1];
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  sVar1 = derTSEQDecStart(&local_58,pki,count,0x30);
  poVar4 = (octet *)0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    poVar5 = pki + sVar1;
    sVar2 = derTSIZEDec2(poVar5,count - sVar1,2,0);
    if (sVar2 != 0xffffffffffffffff) {
      sVar6 = (count - sVar1) - sVar2;
      poVar5 = poVar5 + sVar2;
      sVar1 = derTSEQDecStart(&local_78,poVar5,sVar6,0x30);
      if (sVar1 != 0xffffffffffffffff) {
        sVar6 = sVar6 - sVar1;
        sVar2 = derOIDDec2(poVar5 + sVar1,sVar6,"1.2.112.0.2.0.34.101.45.2.1");
        if (sVar2 != 0xffffffffffffffff) {
          poVar5 = poVar5 + sVar1 + sVar2;
          sVar6 = sVar6 - sVar2;
          sVar1 = derOIDDec2(poVar5,sVar6,"1.2.112.0.2.0.34.101.45.3.0");
          if (sVar1 == 0xffffffffffffffff) {
            sVar1 = derOIDDec2(poVar5,sVar6,"1.2.112.0.2.0.34.101.45.3.1");
            if (sVar1 == 0xffffffffffffffff) {
              sVar1 = derOIDDec2(poVar5,sVar6,"1.2.112.0.2.0.34.101.45.3.2");
              if (sVar1 == 0xffffffffffffffff) {
                sVar1 = derOIDDec2(poVar5,sVar6,"1.2.112.0.2.0.34.101.45.3.3");
                if (sVar1 == 0xffffffffffffffff) {
                  return 0xffffffffffffffff;
                }
                sVar2 = 0x40;
              }
              else {
                sVar2 = 0x30;
              }
            }
            else {
              sVar2 = 0x20;
            }
          }
          else {
            sVar2 = 0x18;
          }
          poVar5 = poVar5 + sVar1;
          sVar3 = derTSEQDecStop(poVar5,&local_78);
          if (sVar3 != 0xffffffffffffffff) {
            poVar5 = poVar5 + sVar3;
            sVar1 = derTOCTDec2(privkey,poVar5,sVar6 - (sVar1 + sVar3),4,sVar2);
            if (sVar1 != 0xffffffffffffffff) {
              sVar6 = derTSEQDecStop(poVar5 + sVar1,&local_58);
              if (sVar6 != 0xffffffffffffffff) {
                if (privkey_len != (size_t *)0x0) {
                  *privkey_len = sVar2;
                }
                poVar4 = poVar5 + sVar1 + (sVar6 - (long)pki);
              }
            }
          }
        }
      }
    }
  }
  return (size_t)poVar4;
}

Assistant:

static size_t bpkiPrivkeyDec(octet privkey[], size_t* privkey_len,
	const octet pki[], size_t count)
{
	der_anchor_t PKI[1];
	der_anchor_t BignAlgId[1];
	const octet* ptr = pki;
	size_t t, len;
	// декодировать
	derDecStep(derSEQDecStart(PKI, ptr, count), ptr, count);
	 derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	 derDecStep(derSEQDecStart(BignAlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_pubkey), ptr, count);
	  if ((t = derOIDDec2(ptr, count, oid_bign_curve192v1)) != SIZE_MAX)
		  len = 24;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve256v1)) != SIZE_MAX)
		  len = 32;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve384v1)) != SIZE_MAX)
		  len = 48;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve512v1)) != SIZE_MAX)
		  len = 64;
	  else
		  return SIZE_MAX;
	  ptr += t, count -= t;
	 derDecStep(derSEQDecStop(ptr, BignAlgId), ptr, count);
	 derDecStep(derOCTDec2(privkey, ptr, count, len), ptr, count);
	derDecStep(derSEQDecStop(ptr, PKI), ptr, count);
	// возвратить длину ключа
	if (privkey_len)
	{
		ASSERT(memIsValid(privkey_len, O_PER_S));
		*privkey_len = len;
	}
	// возвратить точную длину DER-кода
	return ptr - pki;
}